

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecordingDescriptor.h
# Opt level: O2

string * __thiscall
io::aeron::archive::codecs::RecordingDescriptor::getOriginalChannelAsString_abi_cxx11_
          (string *__return_storage_ptr__,RecordingDescriptor *this)

{
  uint64_t uVar1;
  uint64_t uVar2;
  char *pcVar3;
  ulong uVar4;
  
  uVar1 = this->m_position;
  sbePosition(this,uVar1 + 4);
  uVar2 = this->m_position;
  uVar4 = (ulong)*(uint *)(this->m_buffer + uVar1);
  pcVar3 = this->m_buffer + uVar2;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,pcVar3,pcVar3 + uVar4);
  sbePosition(this,uVar2 + uVar4);
  return __return_storage_ptr__;
}

Assistant:

const std::string getOriginalChannelAsString()
    {
        std::uint64_t lengthOfLengthField = 4;
        std::uint64_t lengthPosition = sbePosition();
        sbePosition(lengthPosition + lengthOfLengthField);
        std::uint32_t lengthFieldValue;
        std::memcpy(&lengthFieldValue, m_buffer + lengthPosition, sizeof(std::uint32_t));
        std::uint64_t dataLength = SBE_LITTLE_ENDIAN_ENCODE_32(lengthFieldValue);
        std::uint64_t pos = sbePosition();
        const std::string result(m_buffer + pos, dataLength);
        sbePosition(pos + dataLength);
        return result;
    }